

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

int Aig_ManCounterExampleValueLookup(Aig_Man_t *pAig,int Id,int iFrame)

{
  uint *p;
  int iVar1;
  int iFrame_local;
  int Id_local;
  Aig_Man_t *pAig_local;
  
  if (-1 < Id) {
    iVar1 = Aig_ManObjNumMax(pAig);
    if (Id < iVar1) {
      p = (uint *)pAig->pData2;
      iVar1 = Aig_ManObjNumMax(pAig);
      iVar1 = Abc_InfoHasBit(p,iVar1 * iFrame + Id);
      return iVar1;
    }
  }
  __assert_fail("Id >= 0 && Id < Aig_ManObjNumMax(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigUtil.c"
                ,0x572,"int Aig_ManCounterExampleValueLookup(Aig_Man_t *, int, int)");
}

Assistant:

int Aig_ManCounterExampleValueLookup(  Aig_Man_t * pAig, int Id, int iFrame )
{
    assert( Id >= 0 && Id < Aig_ManObjNumMax(pAig) );
    return Abc_InfoHasBit( (unsigned *)pAig->pData2, Aig_ManObjNumMax(pAig) * iFrame + Id );
}